

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  FieldDescriptor FVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  ExtensionSet *this_00;
  RepeatedField<double> *pRVar7;
  RepeatedPtrFieldBase *pRVar8;
  double *pdVar9;
  Message **ppMVar10;
  unsigned_long *puVar11;
  uint *puVar12;
  float *pfVar13;
  FieldDescriptor *pFVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar15;
  uint uVar16;
  unsigned_long uVar17;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = MutableExtensionSet(this,message);
    ExtensionSet::ClearExtension(this_00,*(int *)(field + 0x28));
    return;
  }
  if (*(int *)(field + 0x30) == 3) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4))
    {
    case 1:
    case 8:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case 2:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      break;
    case 3:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case 4:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      break;
    case 5:
      pRVar7 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      break;
    case 6:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case 7:
      pRVar7 = (RepeatedField<double> *)
               MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      break;
    case 9:
      pRVar8 = &MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          (this,message,field)->super_RepeatedPtrFieldBase;
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(pRVar8);
      return;
    case 10:
      pRVar8 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar8);
      return;
    default:
      return;
    }
    pRVar7->current_size_ = 0;
    return;
  }
  bVar6 = HasBit(this,message,field);
  if (!bVar6) {
    return;
  }
  ClearBit(this,message,field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
    uVar16 = *(uint *)(field + 0x70);
    goto LAB_0020e61f;
  case 2:
    uVar17 = *(unsigned_long *)(field + 0x70);
    puVar11 = (unsigned_long *)MutableRaw<long>(this,message,field);
    goto LAB_0020e646;
  case 3:
    uVar16 = *(uint *)(field + 0x70);
    puVar12 = MutableRaw<unsigned_int>(this,message,field);
    goto LAB_0020e62d;
  case 4:
    uVar17 = *(unsigned_long *)(field + 0x70);
    puVar11 = MutableRaw<unsigned_long>(this,message,field);
LAB_0020e646:
    *puVar11 = uVar17;
    break;
  case 5:
    dVar2 = *(double *)(field + 0x70);
    pdVar9 = MutableRaw<double>(this,message,field);
    *pdVar9 = dVar2;
    break;
  case 6:
    fVar1 = *(float *)(field + 0x70);
    pfVar13 = MutableRaw<float>(this,message,field);
    *pfVar13 = fVar1;
    break;
  case 7:
    FVar3 = field[0x70];
    pFVar14 = (FieldDescriptor *)MutableRaw<bool>(this,message,field);
    *pFVar14 = FVar3;
    break;
  case 8:
    uVar16 = *(uint *)(*(long *)(field + 0x70) + 0x10);
LAB_0020e61f:
    puVar12 = (uint *)MutableRaw<int>(this,message,field);
LAB_0020e62d:
    *puVar12 = uVar16;
    break;
  case 9:
    ppbVar15 = DefaultRaw<std::__cxx11::string_const*>(this,field);
    pbVar4 = *ppbVar15;
    ppbVar15 = MutableRaw<std::__cxx11::string*>(this,message,field);
    pbVar5 = *ppbVar15;
    if (pbVar5 != pbVar4) {
      if (field[0x68] == (FieldDescriptor)0x1) {
        std::__cxx11::string::_M_assign((string *)pbVar5);
        return;
      }
      pbVar5->_M_string_length = 0;
      *(pbVar5->_M_dataplus)._M_p = '\0';
    }
    break;
  case 10:
    ppMVar10 = MutableRaw<google::protobuf::Message*>(this,message,field);
    (*((*ppMVar10)->super_MessageLite)._vptr_MessageLite[4])();
    return;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              const string* default_ptr = DefaultRaw<const string*>(field);
              string** value = MutableRaw<string*>(message, field);
              if (*value != default_ptr) {
                if (field->has_default_value()) {
                  (*value)->assign(field->default_value_string());
                } else {
                  (*value)->clear();
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We don't know which subclass of RepeatedPtrFieldBase the type is,
        // so we use RepeatedPtrFieldBase directly.
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->Clear<GenericTypeHandler<Message> >();
        break;
      }
    }
  }
}